

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1523::run(TestCase1523 *this)

{
  SegmentBuilder *pSVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  ReaderOptions options;
  MallocMessageBuilder copy;
  SegmentArrayMessageReader reader;
  Reader root;
  MallocMessageBuilder builder;
  undefined1 local_488 [32];
  Maybe<kj::Exception> local_468;
  MallocMessageBuilder local_308;
  undefined1 local_218 [232];
  CapTableReader local_130;
  CapTableBuilder *local_128;
  WirePointer *local_120;
  int local_118;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_218,&local_110.super_MessageBuilder);
  local_308.super_MessageBuilder.arenaSpace[1] = (void *)local_218._16_8_;
  local_308.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_218._0_8_;
  local_308.super_MessageBuilder.arenaSpace[0] = (void *)local_218._8_8_;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_468,(PointerBuilder *)&local_308,(StructSize)0x10000);
  local_218._0_8_ = local_468.ptr._0_8_;
  local_218._8_8_ = local_468.ptr.field_1.value.ownFile.content.ptr;
  local_218._16_8_ = local_468.ptr.field_1.value.ownFile.content.disposer;
  PointerBuilder::initList((ListBuilder *)&local_308,(PointerBuilder *)local_218,VOID,0x10000000);
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_110.super_MessageBuilder);
  if (((SegmentBuilder *)AVar2.size_ != (SegmentBuilder *)0x1) && (kj::_::Debug::minSeverity < 3)) {
    local_308.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(local_308.super_MessageBuilder._vptr_MessageBuilder._4_4_,1);
    local_468.ptr._0_8_ = (SegmentBuilder *)AVar2.size_;
    kj::_::Debug::log<char_const(&)[42],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f8,ERROR,"\"failed: expected \" \"(1) == (segments.size())\", 1, segments.size()"
               ,(char (*) [42])"failed: expected (1) == (segments.size())",(int *)&local_308,
               (unsigned_long *)&local_468);
  }
  pSVar1 = (SegmentBuilder *)(AVar2.ptr)->size_;
  if (((SegmentBuilder *)0xf < pSVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_308.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(local_308.super_MessageBuilder._vptr_MessageBuilder._4_4_,0x10);
    local_468.ptr._0_8_ = pSVar1;
    kj::_::Debug::log<char_const(&)[45],unsigned_long,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f9,ERROR,
               "\"failed: expected \" \"(segments[0].size()) < (16)\", segments[0].size(), 16",
               (char (*) [45])"failed: expected (segments[0].size()) < (16)",
               (unsigned_long *)&local_468,(int *)&local_308);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_110.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_218,AVar2,options);
  MessageReader::getRootInternal((Reader *)local_488,(MessageReader *)local_218);
  local_308.super_MessageBuilder.arenaSpace[1] = (void *)local_488._16_8_;
  local_308.super_MessageBuilder.arenaSpace[2] = (void *)local_488._24_8_;
  local_308.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_488._0_8_;
  local_308.super_MessageBuilder.arenaSpace[0] = (void *)local_488._8_8_;
  PointerReader::getStruct((StructReader *)&local_468,(PointerReader *)&local_308,(word *)0x0);
  local_130._vptr_CapTableReader = (_func_int **)local_468.ptr._0_8_;
  if (local_468.ptr.field_1._28_2_ == 0) {
    local_468.ptr.field_1.value.line = 0x7fffffff;
    local_468.ptr.field_1.value.ownFile.content.ptr = (char *)(CapTableBuilder *)0x0;
    local_468.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)(WirePointer *)0x0;
    local_130._vptr_CapTableReader = (_func_int **)(SegmentBuilder *)0x0;
  }
  local_308.super_MessageBuilder.arenaSpace[0] = &local_130;
  local_308.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)&PTR_run_00373250;
  local_128 = (CapTableBuilder *)local_468.ptr.field_1.value.ownFile.content.ptr;
  local_120 = (WirePointer *)local_468.ptr.field_1.value.ownFile.content.disposer;
  local_118 = local_468.ptr.field_1.value.line;
  kj::_::runCatchingExceptions(&local_468,(Runnable *)&local_308);
  if (local_468.ptr.isSet == true) {
    kj::Exception::~Exception(&local_468.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[99]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5fd,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr\""
               ,(char (*) [99])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr"
              );
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_308,0x400,GROW_HEURISTICALLY);
  local_488._0_8_ = &PTR_run_00373280;
  local_488._8_8_ = &local_308;
  local_488._16_8_ = (MessageReader *)local_218;
  kj::_::runCatchingExceptions(&local_468,(Runnable *)local_488);
  if (local_468.ptr.isSet == true) {
    kj::Exception::~Exception(&local_468.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[109]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x600,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr\""
               ,(char (*) [109])
                "failed: expected kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_308);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_218);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  return;
}

Assistant:

TEST(Encoding, VoidListAmplification) {
  MallocMessageBuilder builder;
  builder.initRoot<test::TestAnyPointer>().getAnyPointerField().initAs<List<Void>>(1u << 28);

  auto segments = builder.getSegmentsForOutput();
  EXPECT_EQ(1, segments.size());
  EXPECT_LT(segments[0].size(), 16);  // quite small for such a big list!

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>().getAnyPointerField();
  EXPECT_NONFATAL_FAILURE(root.getAs<List<TestAllTypes>>());

  MallocMessageBuilder copy;
  EXPECT_NONFATAL_FAILURE(copy.setRoot(reader.getRoot<AnyPointer>()));
}